

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O1

TransactionError
node::BroadcastTransaction
          (NodeContext *node,CTransactionRef tx,string *err_string,CAmount *max_tx_fee,bool relay,
          bool wait_callback)

{
  element_type *peVar1;
  pointer pcVar2;
  ValidationSignals *this;
  PeerManager *pPVar3;
  function<void_()> func;
  bool bVar4;
  Chainstate *this_00;
  CCoinsViewCache *this_01;
  Coin *pCVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> err_string_out;
  TransactionError TVar6;
  element_type *tx_00;
  __state_type *__state;
  undefined4 uVar7;
  undefined3 in_register_00000089;
  undefined4 uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  CTransactionRef mempool_tx;
  promise<void> promise;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  MempoolAcceptResult result;
  uint256 wtxid;
  Txid txid;
  undefined8 in_stack_fffffffffffffe28;
  char cVar11;
  promise<void> *local_1b8;
  undefined8 uStack_1b0;
  code *local_1a8;
  code *pcStack_1a0;
  undefined1 local_190 [16];
  promise<void> local_180;
  unique_lock<std::recursive_mutex> local_168;
  undefined1 local_158 [8];
  undefined1 auStack_150 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_108;
  _Storage<long,_true> local_e0;
  bool local_d8;
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_c0;
  bool local_a8;
  pointer local_78 [2];
  size_type local_68;
  size_type sStack_60;
  undefined1 local_58 [16];
  pointer local_48;
  size_type sStack_40;
  long local_38;
  
  uVar8 = CONCAT31(in_register_00000089,relay);
  uVar7 = SUB84(max_tx_fee,0);
  err_string_out =
       tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  tx_00 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((node->chainman)._M_t.
      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
      super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl == (ChainstateManager *)0x0) {
    __assert_fail("node.chainman",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/transaction.cpp"
                  ,0x27,
                  "TransactionError node::BroadcastTransaction(NodeContext &, const CTransactionRef, std::string &, const CAmount &, bool, bool)"
                 );
  }
  if ((node->mempool)._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
      super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
      super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl == (CTxMemPool *)0x0) {
    __assert_fail("node.mempool",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/transaction.cpp"
                  ,0x28,
                  "TransactionError node::BroadcastTransaction(NodeContext &, const CTransactionRef, std::string &, const CAmount &, bool, bool)"
                 );
  }
  if ((node->peerman)._M_t.super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>.
      _M_t.super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
      super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl == (PeerManager *)0x0) {
    __assert_fail("node.peerman",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/transaction.cpp"
                  ,0x29,
                  "TransactionError node::BroadcastTransaction(NodeContext &, const CTransactionRef, std::string &, const CAmount &, bool, bool)"
                 );
  }
  std::promise<void>::promise((promise<void> *)(local_190 + 0x10));
  peVar1 = (element_type *)
           (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_58._0_8_ = *(undefined8 *)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  local_58._8_8_ =
       *(undefined8 *)((peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  local_48 = *(pointer *)((peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  sStack_40 = *(size_type *)((peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  local_78[0] = *(pointer *)(peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
  ;
  local_78[1] = *(pointer *)
                 ((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  local_68 = *(size_type *)
              ((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  sStack_60 = *(size_type *)
               ((peVar1->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  local_168._M_device = &cs_main.super_recursive_mutex;
  local_168._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_168);
  this_00 = ChainstateManager::ActiveChainstate
                      ((node->chainman)._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  this_01 = Chainstate::CoinsTip(this_00);
  peVar1 = (element_type *)
           (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (peVar1->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      auStack_150._8_8_ = local_48;
      auStack_150._16_8_ = sStack_40;
      local_158 = (undefined1  [8])local_58._0_8_;
      auStack_150._0_8_ = local_58._8_8_;
      auStack_150._24_4_ = (undefined4)uVar9;
      pCVar5 = CCoinsViewCache::AccessCoin(this_01,(COutPoint *)local_158);
      if ((pCVar5->out).nValue != -1) {
        TVar6 = ALREADY_IN_UTXO_SET;
        bVar4 = false;
        bVar10 = false;
        goto LAB_00990bb8;
      }
      peVar1 = (element_type *)
               (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)(((long)(peVar1->vout).
                                    super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)(peVar1->vout).
                                    super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 3) * -0x3333333333333333));
  }
  CTxMemPool::get((CTxMemPool *)local_190,
                  (uint256 *)
                  (node->mempool)._M_t.
                  super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                  super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  if (local_190._0_8_ == 0) {
    if ((long)(err_string->_M_dataplus)._M_p < 1) {
      TVar6 = ALREADY_IN_UTXO_SET;
LAB_00990a62:
      ChainstateManager::ProcessTransaction
                ((MempoolAcceptResult *)local_158,
                 (node->chainman)._M_t.
                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,
                 (CTransactionRef *)tx_00,false);
      bVar10 = local_158._0_4_ == VALID;
      if (bVar10) {
        if ((char)uVar7 != '\0') {
          CTxMemPool::AddUnbroadcastTx
                    ((node->mempool)._M_t.
                     super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                     super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                     super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,(uint256 *)local_58);
        }
        if (((char)uVar8 == '\0') ||
           (this = (node->validation_signals)._M_t.
                   super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>
                   .super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl,
           this == (ValidationSignals *)0x0)) goto LAB_00990b25;
        uStack_1b0 = 0;
        local_1b8 = (promise<void> *)(local_190 + 0x10);
        pcStack_1a0 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/transaction.cpp:105:81)>
                      ::_M_invoke;
        local_1a8 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/transaction.cpp:105:81)>
                    ::_M_manager;
        func.super__Function_base._M_functor._8_4_ = uVar7;
        func.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffe28
        ;
        func.super__Function_base._M_functor._12_4_ = uVar8;
        func.super__Function_base._M_manager = (_Manager_type)err_string_out._M_pi;
        func._M_invoker = (_Invoker_type)err_string;
        ValidationSignals::CallFunctionInValidationInterfaceQueue(this,func);
        bVar4 = true;
        if (local_1a8 != (code *)0x0) {
          (*local_1a8)(&local_1b8,&local_1b8,3);
        }
      }
      else {
        TVar6 = HandleATMPError((TxValidationState *)auStack_150,(string *)err_string_out._M_pi);
LAB_00990b25:
        bVar4 = false;
      }
      if (local_a8 == true) {
        local_a8 = false;
        if (local_c0._M_value.
            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c0._M_value.
                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c0._M_value.
                                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - local_c0._0_8_)
          ;
        }
      }
      std::__cxx11::
      _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::_M_clear(&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_150._40_8_ != &local_118) {
        operator_delete((void *)auStack_150._40_8_,(ulong)(local_118._M_allocated_capacity + 1));
      }
      if ((pointer)auStack_150._8_8_ != (pointer)(auStack_150 + 0x18)) {
        operator_delete((void *)auStack_150._8_8_,
                        CONCAT44(auStack_150._28_4_,auStack_150._24_4_) + 1);
      }
      goto LAB_00990ba9;
    }
    ChainstateManager::ProcessTransaction
              ((MempoolAcceptResult *)local_158,
               (node->chainman)._M_t.
               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
               super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,
               (CTransactionRef *)tx_00,true);
    if (local_158._0_4_ != VALID) {
      TVar6 = HandleATMPError((TxValidationState *)auStack_150,(string *)err_string_out._M_pi);
      bVar10 = false;
LAB_009909dc:
      if (local_a8 == true) {
        local_a8 = false;
        if (local_c0._M_value.
            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c0._M_value.
                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c0._M_value.
                                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - local_c0._0_8_)
          ;
        }
      }
      std::__cxx11::
      _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::_M_clear(&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_150._40_8_ != &local_118) {
        operator_delete((void *)auStack_150._40_8_,(ulong)(local_118._M_allocated_capacity + 1));
      }
      if ((pointer)auStack_150._8_8_ != (pointer)(auStack_150 + 0x18)) {
        operator_delete((void *)auStack_150._8_8_,
                        CONCAT44(auStack_150._28_4_,auStack_150._24_4_) + 1);
      }
      if (!bVar10) {
        bVar4 = false;
        bVar10 = false;
        goto LAB_00990ba9;
      }
      goto LAB_00990a62;
    }
    if (local_d8 != false) {
      pcVar2 = (err_string->_M_dataplus)._M_p;
      bVar10 = local_e0._M_value <= (long)pcVar2;
      TVar6 = (uint)((long)pcVar2 < local_e0._M_value) * 3 + ALREADY_IN_UTXO_SET;
      goto LAB_009909dc;
    }
LAB_00990cdf:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    local_78[0] = *(pointer *)(local_190._0_8_ + 0x59);
    local_78[1] = *(pointer *)(local_190._0_8_ + 0x61);
    local_68 = *(size_type *)(local_190._0_8_ + 0x69);
    sStack_60 = *(size_type *)(local_190._0_8_ + 0x71);
    TVar6 = ALREADY_IN_UTXO_SET;
    bVar10 = true;
    bVar4 = false;
LAB_00990ba9:
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
    }
LAB_00990bb8:
    cVar11 = (char)uVar7;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_168);
    if (bVar10) {
      if (bVar4) {
        __state = (__state_type *)(local_190 + 0x10);
        std::__basic_future<void>::__basic_future((__basic_future<void> *)local_158,__state);
        if (local_158 == (undefined1  [8])0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00990ddb;
          std::__throw_future_error(3);
          goto LAB_00990cdf;
        }
        std::__future_base::_State_baseV2::wait((_State_baseV2 *)local_158,__state);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_150._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_150._0_8_);
        }
      }
      TVar6 = OK;
      if (cVar11 != '\0') {
        pPVar3 = (node->peerman)._M_t.
                 super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
                 super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
                 super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl;
        (*(pPVar3->super_CValidationInterface)._vptr_CValidationInterface[0x10])
                  (pPVar3,local_58,local_78);
      }
    }
    std::promise<void>::~promise((promise<void> *)(local_190 + 0x10));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return TVar6;
    }
  }
LAB_00990ddb:
  __stack_chk_fail();
}

Assistant:

TransactionError BroadcastTransaction(NodeContext& node, const CTransactionRef tx, std::string& err_string, const CAmount& max_tx_fee, bool relay, bool wait_callback)
{
    // BroadcastTransaction can be called by RPC or by the wallet.
    // chainman, mempool and peerman are initialized before the RPC server and wallet are started
    // and reset after the RPC sever and wallet are stopped.
    assert(node.chainman);
    assert(node.mempool);
    assert(node.peerman);

    std::promise<void> promise;
    Txid txid = tx->GetHash();
    uint256 wtxid = tx->GetWitnessHash();
    bool callback_set = false;

    {
        LOCK(cs_main);

        // If the transaction is already confirmed in the chain, don't do anything
        // and return early.
        CCoinsViewCache &view = node.chainman->ActiveChainstate().CoinsTip();
        for (size_t o = 0; o < tx->vout.size(); o++) {
            const Coin& existingCoin = view.AccessCoin(COutPoint(txid, o));
            // IsSpent doesn't mean the coin is spent, it means the output doesn't exist.
            // So if the output does exist, then this transaction exists in the chain.
            if (!existingCoin.IsSpent()) return TransactionError::ALREADY_IN_UTXO_SET;
        }

        if (auto mempool_tx = node.mempool->get(txid); mempool_tx) {
            // There's already a transaction in the mempool with this txid. Don't
            // try to submit this transaction to the mempool (since it'll be
            // rejected as a TX_CONFLICT), but do attempt to reannounce the mempool
            // transaction if relay=true.
            //
            // The mempool transaction may have the same or different witness (and
            // wtxid) as this transaction. Use the mempool's wtxid for reannouncement.
            wtxid = mempool_tx->GetWitnessHash();
        } else {
            // Transaction is not already in the mempool.
            if (max_tx_fee > 0) {
                // First, call ATMP with test_accept and check the fee. If ATMP
                // fails here, return error immediately.
                const MempoolAcceptResult result = node.chainman->ProcessTransaction(tx, /*test_accept=*/ true);
                if (result.m_result_type != MempoolAcceptResult::ResultType::VALID) {
                    return HandleATMPError(result.m_state, err_string);
                } else if (result.m_base_fees.value() > max_tx_fee) {
                    return TransactionError::MAX_FEE_EXCEEDED;
                }
            }
            // Try to submit the transaction to the mempool.
            const MempoolAcceptResult result = node.chainman->ProcessTransaction(tx, /*test_accept=*/ false);
            if (result.m_result_type != MempoolAcceptResult::ResultType::VALID) {
                return HandleATMPError(result.m_state, err_string);
            }

            // Transaction was accepted to the mempool.

            if (relay) {
                // the mempool tracks locally submitted transactions to make a
                // best-effort of initial broadcast
                node.mempool->AddUnbroadcastTx(txid);
            }

            if (wait_callback && node.validation_signals) {
                // For transactions broadcast from outside the wallet, make sure
                // that the wallet has been notified of the transaction before
                // continuing.
                //
                // This prevents a race where a user might call sendrawtransaction
                // with a transaction to/from their wallet, immediately call some
                // wallet RPC, and get a stale result because callbacks have not
                // yet been processed.
                node.validation_signals->CallFunctionInValidationInterfaceQueue([&promise] {
                    promise.set_value();
                });
                callback_set = true;
            }
        }
    } // cs_main

    if (callback_set) {
        // Wait until Validation Interface clients have been notified of the
        // transaction entering the mempool.
        promise.get_future().wait();
    }

    if (relay) {
        node.peerman->RelayTransaction(txid, wtxid);
    }

    return TransactionError::OK;
}